

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# flat_hash_map.hpp
# Opt level: O2

pair<ska::detailv3::sherwood_v3_table<const_slang::ast::Symbol_*,_const_slang::ast::Symbol_*,_std::hash<const_slang::ast::Symbol_*>,_ska::detailv3::functor_storage<unsigned_long,_std::hash<const_slang::ast::Symbol_*>_>,_std::equal_to<const_slang::ast::Symbol_*>,_ska::detailv3::functor_storage<bool,_std::equal_to<const_slang::ast::Symbol_*>_>,_slang::StackAllocator<ska::detailv3::sherwood_v3_entry<const_slang::ast::Symbol_*>,_2UL>,_slang::StackAllocator<ska::detailv3::sherwood_v3_entry<const_slang::ast::Symbol_*>,_2UL>_>::templated_iterator<const_slang::ast::Symbol_*>,_bool>
 __thiscall
ska::detailv3::
sherwood_v3_table<slang::ast::Symbol_const*,slang::ast::Symbol_const*,std::hash<slang::ast::Symbol_const*>,ska::detailv3::functor_storage<unsigned_long,std::hash<slang::ast::Symbol_const*>>,std::equal_to<slang::ast::Symbol_const*>,ska::detailv3::functor_storage<bool,std::equal_to<slang::ast::Symbol_const*>>,slang::StackAllocator<ska::detailv3::sherwood_v3_entry<slang::ast::Symbol_const*>,2ul>,slang::StackAllocator<ska::detailv3::sherwood_v3_entry<slang::ast::Symbol_const*>,2ul>>
::emplace<slang::ast::Symbol_const*&>
          (sherwood_v3_table<slang::ast::Symbol_const*,slang::ast::Symbol_const*,std::hash<slang::ast::Symbol_const*>,ska::detailv3::functor_storage<unsigned_long,std::hash<slang::ast::Symbol_const*>>,std::equal_to<slang::ast::Symbol_const*>,ska::detailv3::functor_storage<bool,std::equal_to<slang::ast::Symbol_const*>>,slang::StackAllocator<ska::detailv3::sherwood_v3_entry<slang::ast::Symbol_const*>,2ul>,slang::StackAllocator<ska::detailv3::sherwood_v3_entry<slang::ast::Symbol_const*>,2ul>>
           *this,Symbol **key)

{
  EntryPointer current_entry;
  char distance_from_desired;
  pair<ska::detailv3::sherwood_v3_table<const_slang::ast::Symbol_*,_const_slang::ast::Symbol_*,_std::hash<const_slang::ast::Symbol_*>,_ska::detailv3::functor_storage<unsigned_long,_std::hash<const_slang::ast::Symbol_*>_>,_std::equal_to<const_slang::ast::Symbol_*>,_ska::detailv3::functor_storage<bool,_std::equal_to<const_slang::ast::Symbol_*>_>,_slang::StackAllocator<ska::detailv3::sherwood_v3_entry<const_slang::ast::Symbol_*>,_2UL>,_slang::StackAllocator<ska::detailv3::sherwood_v3_entry<const_slang::ast::Symbol_*>,_2UL>_>::templated_iterator<const_slang::ast::Symbol_*>,_bool>
  pVar1;
  
  current_entry =
       (EntryPointer)
       (((ulong)((long)*key * -0x61c8864680b583eb) >> ((byte)this[0x18] & 0x3f)) * 0x10 +
       *(long *)(this + 8));
  distance_from_desired = '\0';
  while( true ) {
    if (current_entry->distance_from_desired < distance_from_desired) {
      pVar1 = emplace_new_key<slang::ast::Symbol_const*&>
                        (this,distance_from_desired,current_entry,key);
      return pVar1;
    }
    if (*key == (current_entry->field_1).value) break;
    current_entry = current_entry + 1;
    distance_from_desired = distance_from_desired + '\x01';
  }
  pVar1._8_8_ = 0;
  pVar1.first.current = current_entry;
  return pVar1;
}

Assistant:

std::pair<iterator, bool> emplace(Key && key, Args &&... args)
    {
        size_t index = hash_policy.index_for_hash(hash_object(key), num_slots_minus_one);
        EntryPointer current_entry = entries + ptrdiff_t(index);
        int8_t distance_from_desired = 0;
        for (; current_entry->distance_from_desired >= distance_from_desired; ++current_entry, ++distance_from_desired)
        {
            if (compares_equal(key, current_entry->value))
                return { { current_entry }, false };
        }
        return emplace_new_key(distance_from_desired, current_entry, std::forward<Key>(key), std::forward<Args>(args)...);
    }